

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

_Bool ssh_scp_recv(void *vbuf,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t got;
  char *buf;
  size_t len_local;
  void *vbuf_local;
  
  got = (size_t)vbuf;
  buf = (char *)len;
  do {
    if (buf == (char *)0x0) {
      return true;
    }
    while (sVar2 = bufchain_size(&received_data), sVar2 == 0) {
      iVar1 = backend_exitcode(backend);
      if ((-1 < iVar1) || (iVar1 = ssh_sftp_loop_iteration(), iVar1 < 0)) {
        return false;
      }
    }
    sVar2 = bufchain_fetch_consume_up_to(&received_data,(void *)got,(size_t)buf);
    got = sVar2 + got;
    buf = buf + -sVar2;
  } while( true );
}

Assistant:

static bool ssh_scp_recv(void *vbuf, size_t len)
{
    char *buf = (char *)vbuf;
    while (len > 0) {
        while (bufchain_size(&received_data) == 0) {
            if (backend_exitcode(backend) >= 0 ||
                ssh_sftp_loop_iteration() < 0)
                return false;          /* doom */
        }

        size_t got = bufchain_fetch_consume_up_to(&received_data, buf, len);
        buf += got;
        len -= got;
    }

    return true;
}